

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O2

bool dxil_spv::value_is_wave_lane(Value *value)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  CallInst *this;
  Function *this_00;
  String *pSVar3;
  uint32_t op;
  
  op = (uint32_t)((ulong)in_RAX >> 0x20);
  this = LLVMBC::dyn_cast<LLVMBC::CallInst>(value);
  if (this != (CallInst *)0x0) {
    this_00 = LLVMBC::CallInst::getCalledFunction(this);
    pSVar3 = LLVMBC::Function::getName_abi_cxx11_(this_00);
    iVar2 = strncmp((pSVar3->_M_dataplus)._M_p,"dx.op",5);
    if (iVar2 == 0) {
      bVar1 = get_constant_operand(&this->super_Instruction,0,&op);
      return op == 0x6f && bVar1;
    }
  }
  return false;
}

Assistant:

static bool value_is_wave_lane(const llvm::Value *value)
{
	auto *dxil_op = llvm::dyn_cast<llvm::CallInst>(value);
	if (!dxil_op)
		return false;
	if (strncmp(dxil_op->getCalledFunction()->getName().data(), "dx.op", 5) != 0)
		return false;

	uint32_t op;
	if (!get_constant_operand(dxil_op, 0, &op))
		return false;

	return DXIL::Op(op) == DXIL::Op::WaveGetLaneIndex;
}